

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.h
# Opt level: O2

t_value<xemmai::t_pointer> __thiscall
xemmai::t_value<xemmai::t_slot>::f_get_at(t_value<xemmai::t_slot> *this,t_pvalue *a_index)

{
  t_pvalue *a_stack;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar1;
  t_object *ptVar2;
  undefined8 *in_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  t_value<xemmai::t_pointer> tVar5;
  
  ptVar2 = f_object_or_throw((t_value<xemmai::t_slot> *)a_index);
  a_stack = *(t_pvalue **)(in_FS_OFFSET + -0x30);
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = a_stack + 3;
  a_stack[2].super_t_pointer.v_p = (t_object *)*in_RDX;
  a_stack[2].field_0 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)(in_RDX + 1);
  auVar4 = (undefined1  [16])(*ptVar2->v_type->f_get_at)(ptVar2,a_stack);
  aVar3.v_integer = auVar4._8_8_;
  if (auVar4._0_8_ != 0xffffffffffffffff) {
    f_loop(a_stack,auVar4._0_8_);
    aVar3 = extraout_RDX;
  }
  aVar1 = a_stack->field_0;
  (this->super_t_slot).v_p._M_b._M_p = (a_stack->super_t_pointer).v_p;
  this->field_0 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2)aVar1;
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = a_stack;
  tVar5.field_0.v_integer = aVar3.v_integer;
  tVar5.super_t_pointer.v_p = (t_object *)this;
  return tVar5;
}

Assistant:

inline t_pvalue t_value<T_tag>::f_get_at(const t_pvalue& a_index) const
{
	auto p = f_object_or_throw();
	t_scoped_stack stack(3);
	stack[2] = a_index;
	size_t n = p->f_type()->f_get_at(p, stack);
	if (n != size_t(-1)) f_loop(stack, n);
	return stack[0];
}